

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

bool Search::must_run_test(vw *all,multi_ex *ec,bool is_test_ex)

{
  bool bVar1;
  size_t sVar2;
  reference ppeVar3;
  byte in_DL;
  vw *in_RSI;
  long in_RDI;
  bool local_14;
  bool local_13;
  bool local_12;
  
  sVar2 = v_array<int>::size((v_array<int> *)(in_RDI + 0x3510));
  local_12 = true;
  if (sVar2 == 0) {
    bVar1 = might_print_update(in_RSI);
    local_12 = true;
    if (((!bVar1) && (local_12 = true, *(int *)(in_RDI + 0x3530) < 1)) &&
       (((*(byte *)(in_RDI + 0xd8) & 1) != 0 || (local_12 = true, (in_DL & 1) == 0)))) {
      if ((((*(byte *)(in_RDI + 0x3439) & 1) == 0) ||
          (local_13 = false, (*(byte *)(in_RDI + 0xd8) & 1) == 0)) &&
         (local_13 = false, (in_DL & 1) == 0)) {
        local_14 = true;
        if ((*(byte *)(in_RDI + 0x3457) & 1) == 0) {
          ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)in_RSI,0);
          local_14 = true;
          if (((*ppeVar3)->test_only & 1U) == 0) {
            local_14 = *(long *)(in_RDI + 0x48) == 0;
          }
        }
        local_13 = local_14;
      }
      local_12 = local_13;
    }
  }
  return local_12;
}

Assistant:

bool must_run_test(vw& all, multi_ex& ec, bool is_test_ex)
{
  return (all.final_prediction_sink.size() > 0) ||  // if we have to produce output, we need to run this
      might_print_update(all) ||                    // if we have to print and update to stderr
      (all.raw_prediction > 0) ||                   // we need raw predictions
      ((!all.vw_is_main) && (is_test_ex)) ||        // library needs predictions
      // or:
      //   it's not quiet AND
      //     current_pass == 0
      //     OR holdout is off
      //     OR it's a test example
      ((!all.quiet || !all.vw_is_main) &&  // had to disable this because of library mode!
          (!is_test_ex) &&
          (all.holdout_set_off ||                          // no holdout
              ec[0]->test_only || (all.current_pass == 0)  // we need error rates for progressive cost
              ));
}